

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashna::HashLen0to16(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t mul_00;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong in_RSI;
  byte *in_RDI;
  uint32_t z;
  uint32_t y;
  uint8_t c_1;
  uint8_t b_1;
  uint8_t a_2;
  uint64_t a_1;
  uint64_t mul_1;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  undefined8 in_stack_ffffffffffffff98;
  int shift;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint64_t local_8;
  
  if (in_RSI < 8) {
    if (in_RSI < 4) {
      if (in_RSI == 0) {
        local_8 = 0x9ae16a3b2f90404f;
      }
      else {
        local_8 = ShiftMix((ulong)((uint)*in_RDI + (uint)in_RDI[in_RSI >> 1] * 0x100) *
                           -0x651e95c4d06fbfb1 ^
                           (ulong)((int)in_RSI + (uint)in_RDI[in_RSI - 1] * 4) * -0x3c5a37a36834ced9
                          );
        local_8 = local_8 * -0x651e95c4d06fbfb1;
      }
    }
    else {
      uVar1 = util::Fetch32((char *)in_RDI);
      uVar2 = util::Fetch32((char *)(in_RDI + (in_RSI - 4)));
      local_8 = HashLen16(in_RSI + (ulong)uVar1 * 8,(ulong)uVar2,in_RSI * 2 + 0x9ae16a3b2f90404f);
    }
  }
  else {
    mul_00 = in_RSI * 2 + 0x9ae16a3b2f90404f;
    uVar3 = util::Fetch64((char *)in_RDI);
    uVar4 = util::Fetch64((char *)(in_RDI + (in_RSI - 8)));
    shift = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    uVar5 = util::Rotate64(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),shift);
    uVar6 = util::Rotate64(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),shift);
    local_8 = HashLen16(uVar5 * mul_00 + uVar3 + 0x9ae16a3b2f90404f,(uVar6 + uVar4) * mul_00,mul_00)
    ;
  }
  return local_8;
}

Assistant:

STATIC_INLINE uint64_t HashLen0to16(const char *s, size_t len) {
  if (len >= 8) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = Fetch(s) + k2;
    uint64_t b = Fetch(s + len - 8);
    uint64_t c = Rotate(b, 37) * mul + a;
    uint64_t d = (Rotate(a, 25) + b) * mul;
    return HashLen16(c, d, mul);
  }
  if (len >= 4) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4), mul);
  }
  if (len > 0) {
    uint8_t a = s[0];
    uint8_t b = s[len >> 1];
    uint8_t c = s[len - 1];
    uint32_t y = static_cast<uint32_t>(a) + (static_cast<uint32_t>(b) << 8);
    uint32_t z = len + (static_cast<uint32_t>(c) << 2);
    return ShiftMix(y * k2 ^ z * k0) * k2;
  }
  return k2;
}